

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURL * curl_easy_duphandle(CURL *incurl)

{
  CURLcode CVar1;
  SessionHandle *dst;
  char *pcVar2;
  CookieInfo *pCVar3;
  curl_slist *pcVar4;
  SessionHandle *outcurl;
  SessionHandle *data;
  CURL *incurl_local;
  
  dst = (SessionHandle *)(*Curl_ccalloc)(1,0x8ba8);
  if (dst != (SessionHandle *)0x0) {
    pcVar2 = (char *)(*Curl_cmalloc)(0x100);
    (dst->state).headerbuff = pcVar2;
    if ((dst->state).headerbuff != (char *)0x0) {
      (dst->state).headersize = 0x100;
      CVar1 = Curl_dupset(dst,(SessionHandle *)incurl);
      if (CVar1 == CURLE_OK) {
        (dst->state).conn_cache = (conncache *)0x0;
        (dst->state).lastconnect = (connectdata *)0x0;
        (dst->progress).flags = *(int *)((long)incurl + 0x730);
        (dst->progress).callback = (_Bool)(*(byte *)((long)incurl + 0x728) & 1);
        if (*(long *)((long)incurl + 0x6f0) != 0) {
          pCVar3 = Curl_cookie_init((SessionHandle *)incurl,
                                    *(char **)(*(long *)((long)incurl + 0x6f0) + 8),dst->cookies,
                                    (_Bool)(*(byte *)((long)incurl + 0x359) & 1));
          dst->cookies = pCVar3;
          if (dst->cookies == (CookieInfo *)0x0) goto LAB_0087ede9;
        }
        if (*(long *)((long)incurl + 0x6e0) != 0) {
          pcVar4 = Curl_slist_duplicate(*(curl_slist **)((long)incurl + 0x6e0));
          (dst->change).cookielist = pcVar4;
          if ((dst->change).cookielist == (curl_slist *)0x0) goto LAB_0087ede9;
        }
        if (*(long *)((long)incurl + 0x6c0) != 0) {
          pcVar2 = (*Curl_cstrdup)(*(char **)((long)incurl + 0x6c0));
          (dst->change).url = pcVar2;
          if ((dst->change).url == (char *)0x0) goto LAB_0087ede9;
          (dst->change).url_alloc = true;
        }
        if (*(long *)((long)incurl + 0x6d0) != 0) {
          pcVar2 = (*Curl_cstrdup)(*(char **)((long)incurl + 0x6d0));
          (dst->change).referer = pcVar2;
          if ((dst->change).referer == (char *)0x0) goto LAB_0087ede9;
          (dst->change).referer_alloc = true;
        }
        dst->magic = 0xc0dedbad;
        return dst;
      }
    }
  }
LAB_0087ede9:
  if (dst != (SessionHandle *)0x0) {
    curl_slist_free_all((dst->change).cookielist);
    (dst->change).cookielist = (curl_slist *)0x0;
    (*Curl_cfree)((dst->state).headerbuff);
    (dst->state).headerbuff = (char *)0x0;
    (*Curl_cfree)((dst->change).url);
    (dst->change).url = (char *)0x0;
    (*Curl_cfree)((dst->change).referer);
    (dst->change).referer = (char *)0x0;
    Curl_freeset(dst);
    (*Curl_cfree)(dst);
  }
  return (CURL *)0x0;
}

Assistant:

CURL *curl_easy_duphandle(CURL *incurl)
{
  struct SessionHandle *data=(struct SessionHandle *)incurl;

  struct SessionHandle *outcurl = calloc(1, sizeof(struct SessionHandle));
  if(NULL == outcurl)
    goto fail;

  /*
   * We setup a few buffers we need. We should probably make them
   * get setup on-demand in the code, as that would probably decrease
   * the likeliness of us forgetting to init a buffer here in the future.
   */
  outcurl->state.headerbuff = malloc(HEADERSIZE);
  if(!outcurl->state.headerbuff)
    goto fail;
  outcurl->state.headersize = HEADERSIZE;

  /* copy all userdefined values */
  if(Curl_dupset(outcurl, data))
    goto fail;

  /* the connection cache is setup on demand */
  outcurl->state.conn_cache = NULL;

  outcurl->state.lastconnect = NULL;

  outcurl->progress.flags    = data->progress.flags;
  outcurl->progress.callback = data->progress.callback;

  if(data->cookies) {
    /* If cookies are enabled in the parent handle, we enable them
       in the clone as well! */
    outcurl->cookies = Curl_cookie_init(data,
                                        data->cookies->filename,
                                        outcurl->cookies,
                                        data->set.cookiesession);
    if(!outcurl->cookies)
      goto fail;
  }

  /* duplicate all values in 'change' */
  if(data->change.cookielist) {
    outcurl->change.cookielist =
      Curl_slist_duplicate(data->change.cookielist);
    if(!outcurl->change.cookielist)
      goto fail;
  }

  if(data->change.url) {
    outcurl->change.url = strdup(data->change.url);
    if(!outcurl->change.url)
      goto fail;
    outcurl->change.url_alloc = TRUE;
  }

  if(data->change.referer) {
    outcurl->change.referer = strdup(data->change.referer);
    if(!outcurl->change.referer)
      goto fail;
    outcurl->change.referer_alloc = TRUE;
  }

  /* Clone the resolver handle, if present, for the new handle */
  if(Curl_resolver_duphandle(&outcurl->state.resolver,
                             data->state.resolver))
    goto fail;

  Curl_convert_setup(outcurl);

  outcurl->magic = CURLEASY_MAGIC_NUMBER;

  /* we reach this point and thus we are OK */

  return outcurl;

  fail:

  if(outcurl) {
    curl_slist_free_all(outcurl->change.cookielist);
    outcurl->change.cookielist = NULL;
    Curl_safefree(outcurl->state.headerbuff);
    Curl_safefree(outcurl->change.url);
    Curl_safefree(outcurl->change.referer);
    Curl_freeset(outcurl);
    free(outcurl);
  }

  return NULL;
}